

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CTypeID cp_decl_enum(CPState *cp,CPDecl *sdecl)

{
  CTypeID CVar1;
  int iVar2;
  CTypeID id;
  CPState *in_RDI;
  CTypeID constid;
  CType *ct;
  GCstr *name;
  CTypeID lastid;
  CPValue k;
  CTSize esize;
  CTInfo einfo;
  CTypeID eid;
  undefined4 in_stack_ffffffffffffff48;
  CPToken in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  CTypeID in_stack_ffffffffffffff54;
  CPDecl *in_stack_ffffffffffffff58;
  CPState *in_stack_ffffffffffffff60;
  CTState *cts;
  uint local_98;
  CPDeclIdx local_94;
  uint local_90;
  CTInfo local_88;
  
  CVar1 = cp_struct_name(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         in_stack_ffffffffffffff54);
  local_88 = 0x5002000a;
  iVar2 = cp_opt((CPState *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
  if (iVar2 != 0) {
    local_94 = 0;
    local_90 = 9;
    local_98 = CVar1;
    do {
      cts = (CTState *)in_RDI->str;
      if (in_RDI->tok != 0x100) {
        cp_err_token((CPState *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff4c);
      }
      if ((in_RDI->val).id != 0) {
        cp_errmsg(in_RDI,0,LJ_ERR_FFI_REDEF,&cts->L);
      }
      cp_next((CPState *)0x17c1f5);
      iVar2 = cp_opt((CPState *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
      if (iVar2 != 0) {
        cp_expr_kint((CPState *)in_stack_ffffffffffffff58,
                     (CPValue *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        if (local_90 == 10) {
          if (-1 < (int)local_94) {
            local_90 = 9;
          }
        }
        else {
          local_90 = 9;
          if ((int)local_94 < 0) {
            local_88 = 0x50020009;
          }
        }
      }
      id = lj_ctype_new(cts,(CType **)in_stack_ffffffffffffff58);
      in_RDI->cts->tab[local_98].sib = (CTypeID1)id;
      *(byte *)((long)&cts->tab + 4) = *(byte *)((long)&cts->tab + 4) | 0x20;
      in_stack_ffffffffffffff58->mode = (uint32_t)cts;
      in_stack_ffffffffffffff58->top = (local_90 | 0x2000000) + 0xb0000000;
      in_stack_ffffffffffffff58->pos = local_94;
      if (local_94 + 1 == 0x80000000) {
        local_90 = 10;
      }
      in_stack_ffffffffffffff54 = id;
      lj_ctype_addname(in_RDI->cts,(CType *)in_stack_ffffffffffffff58,id);
      iVar2 = cp_opt((CPState *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
    } while ((iVar2 != 0) && (local_98 = id, local_94 = local_94 + 1, in_RDI->tok != 0x7d));
    cp_check((CPState *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4c);
    in_RDI->cts->tab[CVar1].info = local_88;
    in_RDI->cts->tab[CVar1].size = 4;
  }
  return CVar1;
}

Assistant:

static CTypeID cp_decl_enum(CPState *cp, CPDecl *sdecl)
{
  CTypeID eid = cp_struct_name(cp, sdecl, CTINFO(CT_ENUM, CTID_VOID));
  CTInfo einfo = CTINFO(CT_ENUM, CTALIGN(2) + CTID_UINT32);
  CTSize esize = 4;  /* Only 32 bit enums are supported. */
  if (cp_opt(cp, '{')) {  /* Enum definition. */
    CPValue k;
    CTypeID lastid = eid;
    k.u32 = 0;
    k.id = CTID_INT32;
    do {
      GCstr *name = cp->str;
      if (cp->tok != CTOK_IDENT) cp_err_token(cp, CTOK_IDENT);
      if (cp->val.id) cp_errmsg(cp, 0, LJ_ERR_FFI_REDEF, strdata(name));
      cp_next(cp);
      if (cp_opt(cp, '=')) {
	cp_expr_kint(cp, &k);
	if (k.id == CTID_UINT32) {
	  /* C99 says that enum constants are always (signed) integers.
	  ** But since unsigned constants like 0x80000000 are quite common,
	  ** those are left as uint32_t.
	  */
	  if (k.i32 >= 0) k.id = CTID_INT32;
	} else {
	  /* OTOH it's common practice and even mandated by some ABIs
	  ** that the enum type itself is unsigned, unless there are any
	  ** negative constants.
	  */
	  k.id = CTID_INT32;
	  if (k.i32 < 0) einfo = CTINFO(CT_ENUM, CTALIGN(2) + CTID_INT32);
	}
      }
      /* Add named enum constant. */
      {
	CType *ct;
	CTypeID constid = lj_ctype_new(cp->cts, &ct);
	ctype_get(cp->cts, lastid)->sib = constid;
	lastid = constid;
	ctype_setname(ct, name);
	ct->info = CTINFO(CT_CONSTVAL, CTF_CONST|k.id);
	ct->size = k.u32++;
	if (k.u32 == 0x80000000u) k.id = CTID_UINT32;
	lj_ctype_addname(cp->cts, ct, constid);
      }
      if (!cp_opt(cp, ',')) break;
    } while (cp->tok != '}');  /* Trailing ',' is ok. */
    cp_check(cp, '}');
    /* Complete enum. */
    ctype_get(cp->cts, eid)->info = einfo;
    ctype_get(cp->cts, eid)->size = esize;
  }
  return eid;
}